

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

void sndio_destroy(cubeb_conflict2 *context)

{
  if (context->libsndio != (void *)0x0) {
    dlclose();
  }
  free(context);
  return;
}

Assistant:

static void
sndio_destroy(cubeb * context)
{
  DPR("sndio_destroy()\n");
#ifndef DISABLE_LIBSNDIO_DLOPEN
  if (context->libsndio)
    dlclose(context->libsndio);
#endif
  free(context);
}